

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  pointer pcVar1;
  bool bVar2;
  error_category *peVar3;
  int *piVar4;
  path base;
  path local_100;
  path local_e0;
  path local_c0;
  path local_a0;
  path local_80;
  path local_60;
  path local_40;
  
  peVar3 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar3;
  current_path(&local_e0,ec);
  if (ec->_M_value != 0) {
    piVar4 = __errno_location();
    ec->_M_value = *piVar4;
    ec->_M_cat = peVar3;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_00156441;
  }
  if ((p->_path)._M_string_length == 0) {
LAB_001562f4:
    operator/(__return_storage_ptr__,&local_e0,p);
  }
  else {
    bVar2 = path::has_root_name(p);
    if (bVar2) {
      bVar2 = path::has_root_directory(p);
      if (bVar2) {
        (__return_storage_ptr__->_path)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_path).field_2;
        pcVar1 = (p->_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (p->_path)._M_string_length);
        goto LAB_00156441;
      }
      path::root_name(&local_60,p);
      path::root_directory(&local_80,&local_e0);
      operator/(&local_40,&local_60,&local_80);
      path::relative_path(&local_a0,&local_e0);
      operator/(&local_100,&local_40,&local_a0);
      path::relative_path(&local_c0,p);
      operator/(__return_storage_ptr__,&local_100,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._path._M_dataplus._M_p != &local_c0._path.field_2) {
        operator_delete(local_c0._path._M_dataplus._M_p,
                        local_c0._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._path._M_dataplus._M_p != &local_100._path.field_2) {
        operator_delete(local_100._path._M_dataplus._M_p,
                        local_100._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._path._M_dataplus._M_p != &local_a0._path.field_2) {
        operator_delete(local_a0._path._M_dataplus._M_p,
                        local_a0._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._path._M_dataplus._M_p != &local_40._path.field_2) {
        operator_delete(local_40._path._M_dataplus._M_p,
                        local_40._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._path._M_dataplus._M_p != &local_80._path.field_2) {
        operator_delete(local_80._path._M_dataplus._M_p,
                        local_80._path.field_2._M_allocated_capacity + 1);
      }
      local_100._path.field_2._M_allocated_capacity = local_60._path.field_2._M_allocated_capacity;
      local_100._path._M_dataplus._M_p = local_60._path._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._path._M_dataplus._M_p == &local_60._path.field_2) goto LAB_00156441;
    }
    else {
      bVar2 = path::has_root_directory(p);
      if (!bVar2) goto LAB_001562f4;
      path::root_name(&local_100,&local_e0);
      operator/(__return_storage_ptr__,&local_100,p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._path._M_dataplus._M_p == &local_100._path.field_2) goto LAB_00156441;
    }
    operator_delete(local_100._path._M_dataplus._M_p,
                    local_100._path.field_2._M_allocated_capacity + 1);
  }
LAB_00156441:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._path._M_dataplus._M_p != &local_e0._path.field_2) {
    operator_delete(local_e0._path._M_dataplus._M_p,local_e0._path.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(p.wstring().c_str(), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(p.wstring().c_str(), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}